

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov5.cpp
# Opt level: O0

void generate_proposals(Mat *anchors,int stride,Mat *in_pad,Mat *feat_blob,float prob_threshold,
                       vector<Object,_std::allocator<Object>_> *objects)

{
  void *pvVar1;
  long *in_RCX;
  long lVar2;
  long in_RDX;
  int in_ESI;
  long *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  value_type *__x;
  Object obj;
  float y1;
  float x1;
  float y0;
  float x0;
  float pb_h;
  float pb_w;
  float pb_cy;
  float pb_cx;
  float dh;
  float dw;
  float dy;
  float dx;
  float confidence;
  float score;
  int k;
  float class_score;
  int class_index;
  float box_confidence;
  float *featptr;
  int j;
  int i;
  Mat feat;
  float anchor_h;
  float anchor_w;
  int q;
  int num_anchors;
  int num_class;
  int num_grid_y;
  int num_grid_x;
  int num_grid;
  Mat *m;
  int local_1b4;
  float local_1b0;
  int local_190;
  int local_18c;
  void *local_188;
  int *local_180;
  ulong local_178;
  undefined4 local_170;
  long *local_168;
  int local_160;
  int local_15c;
  int local_158;
  undefined4 local_154;
  undefined4 local_150;
  ulong local_148;
  undefined4 local_140;
  undefined4 local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  float local_114;
  long *local_110;
  long *local_f8;
  void **local_f0;
  long local_e0;
  long local_d0;
  undefined1 local_bd;
  int local_bc;
  void **local_b0;
  int local_9c;
  void **local_98;
  long *local_90;
  undefined4 local_84;
  ulong local_80;
  void *local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  void **local_60;
  undefined4 local_54;
  long local_50;
  int local_28;
  undefined4 local_24;
  void **local_20;
  void *local_18;
  
  local_124 = (int)in_RCX[6];
  if (*(int *)(in_RDX + 0x30) < *(int *)(in_RDX + 0x2c)) {
    local_128 = *(int *)(in_RDX + 0x2c) / in_ESI;
    local_12c = local_124 / local_128;
  }
  else {
    local_12c = *(int *)(in_RDX + 0x30) / in_ESI;
    local_128 = local_124 / local_12c;
  }
  local_130 = *(int *)((long)in_RCX + 0x2c) + -5;
  local_134 = *(int *)((long)in_RDI + 0x2c) / 2;
  local_114 = in_XMM0_Da;
  local_110 = in_RCX;
  local_f8 = in_RDI;
  for (local_138 = 0; local_138 < local_134; local_138 = local_138 + 1) {
    local_d0 = (long)(local_138 << 1);
    local_13c = *(undefined4 *)(*local_f8 + local_d0 * 4);
    local_e0 = (long)(local_138 * 2 + 1);
    local_140 = *(undefined4 *)(*local_f8 + local_e0 * 4);
    local_b0 = &local_188;
    local_64 = *(int *)((long)local_110 + 0x2c);
    local_68 = (int)local_110[6];
    local_6c = *(undefined4 *)((long)local_110 + 0x34);
    local_78 = (void *)(*local_110 + local_110[8] * (long)local_138 * local_110[2]);
    local_80 = local_110[2];
    local_84 = (undefined4)local_110[3];
    local_90 = (long *)local_110[4];
    local_60 = &local_188;
    local_180 = (int *)0x0;
    local_154 = 1;
    local_50 = (long)local_64 * (long)local_68 * local_80;
    local_148 = (local_50 + 0xfU & 0xfffffffffffffff0) / local_80;
    local_160 = (int)local_110[5] + -1;
    if ((int)local_110[5] == 4) {
      local_148 = (long)*(int *)((long)local_110 + 0x2c) * (long)(int)local_110[6];
    }
    local_54 = 0x10;
    local_bc = local_138;
    local_bd = 1;
    local_188 = local_78;
    local_178 = local_80;
    local_170 = local_84;
    local_168 = local_90;
    local_15c = local_64;
    local_158 = local_68;
    local_150 = local_6c;
    for (local_18c = 0; local_18c < local_12c; local_18c = local_18c + 1) {
      for (local_190 = 0; pvVar1 = local_188, local_190 < local_128; local_190 = local_190 + 1) {
        local_9c = local_18c * local_128 + local_190;
        local_98 = &local_188;
        lVar2 = (long)local_15c * (long)local_9c * local_178;
        fVar3 = sigmoid(0.0);
        if (local_114 <= fVar3) {
          local_1b0 = -3.4028235e+38;
          for (local_1b4 = 0; local_1b4 < local_130; local_1b4 = local_1b4 + 1) {
            fVar4 = *(float *)((long)pvVar1 + (long)(local_1b4 + 5) * 4 + lVar2);
            if (local_1b0 < fVar4) {
              local_1b0 = fVar4;
            }
          }
          fVar4 = sigmoid(0.0);
          if (local_114 <= fVar3 * fVar4) {
            sigmoid(0.0);
            sigmoid(0.0);
            fVar3 = sigmoid(0.0);
            fVar4 = sigmoid(0.0);
            __x = (value_type *)std::pow<float,int>(0.0,0x1292e0);
            std::pow<float,int>(0.0,0x129323);
            Object::Object((Object *)0x1293ea);
            std::vector<Object,_std::allocator<Object>_>::push_back
                      ((vector<Object,_std::allocator<Object>_> *)CONCAT44(fVar3,fVar4),__x);
          }
        }
      }
    }
    local_f0 = &local_188;
    local_20 = local_f0;
    if (local_180 != (int *)0x0) {
      local_24 = 0xffffffff;
      LOCK();
      local_28 = *local_180;
      *local_180 = *local_180 + -1;
      UNLOCK();
      if (local_28 == 1) {
        if (local_168 == (long *)0x0) {
          local_18 = local_188;
          if (local_188 != (void *)0x0) {
            free(local_188);
          }
        }
        else {
          (**(code **)(*local_168 + 0x18))(local_168,local_188);
        }
      }
    }
  }
  return;
}

Assistant:

static void generate_proposals(const ncnn::Mat& anchors, int stride, const ncnn::Mat& in_pad, const ncnn::Mat& feat_blob, float prob_threshold, std::vector<Object>& objects)
{
    const int num_grid = feat_blob.h;

    int num_grid_x;
    int num_grid_y;
    if (in_pad.w > in_pad.h)
    {
        num_grid_x = in_pad.w / stride;
        num_grid_y = num_grid / num_grid_x;
    }
    else
    {
        num_grid_y = in_pad.h / stride;
        num_grid_x = num_grid / num_grid_y;
    }

    const int num_class = feat_blob.w - 5;

    const int num_anchors = anchors.w / 2;

    for (int q = 0; q < num_anchors; q++)
    {
        const float anchor_w = anchors[q * 2];
        const float anchor_h = anchors[q * 2 + 1];

        const ncnn::Mat feat = feat_blob.channel(q);

        for (int i = 0; i < num_grid_y; i++)
        {
            for (int j = 0; j < num_grid_x; j++)
            {
                const float* featptr = feat.row(i * num_grid_x + j);
                float box_confidence = sigmoid(featptr[4]);
                if (box_confidence >= prob_threshold)
                {
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int k = 0; k < num_class; k++)
                    {
                        float score = featptr[5 + k];
                        if (score > class_score)
                        {
                            class_index = k;
                            class_score = score;
                        }
                    }
                    float confidence = box_confidence * sigmoid(class_score);
                    if (confidence >= prob_threshold)
                    {
                        // yolov5/models/yolo.py Detect forward
                        // y = x[i].sigmoid()
                        // y[..., 0:2] = (y[..., 0:2] * 2. - 0.5 + self.grid[i].to(x[i].device)) * self.stride[i]  # xy
                        // y[..., 2:4] = (y[..., 2:4] * 2) ** 2 * self.anchor_grid[i]  # wh

                        float dx = sigmoid(featptr[0]);
                        float dy = sigmoid(featptr[1]);
                        float dw = sigmoid(featptr[2]);
                        float dh = sigmoid(featptr[3]);

                        float pb_cx = (dx * 2.f - 0.5f + j) * stride;
                        float pb_cy = (dy * 2.f - 0.5f + i) * stride;

                        float pb_w = pow(dw * 2.f, 2) * anchor_w;
                        float pb_h = pow(dh * 2.f, 2) * anchor_h;

                        float x0 = pb_cx - pb_w * 0.5f;
                        float y0 = pb_cy - pb_h * 0.5f;
                        float x1 = pb_cx + pb_w * 0.5f;
                        float y1 = pb_cy + pb_h * 0.5f;

                        Object obj;
                        obj.rect.x = x0;
                        obj.rect.y = y0;
                        obj.rect.width = x1 - x0;
                        obj.rect.height = y1 - y0;
                        obj.label = class_index;
                        obj.prob = confidence;

                        objects.push_back(obj);
                    }
                }
            }
        }
    }
}